

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_movingcamera.cpp
# Opt level: O1

void __thiscall AMovingCamera::PostBeginPlay(AMovingCamera *this)

{
  AActor *pAVar1;
  TActorIterator<AActor> iterator;
  TActorIterator<AActor> local_18;
  
  APathFollower::PostBeginPlay(&this->super_APathFollower);
  (this->Activator).field_0.p = (AActor *)0x0;
  local_18.super_FActorIterator.id = (this->super_APathFollower).super_AActor.args[3];
  if (local_18.super_FActorIterator.id != 0) {
    local_18.super_FActorIterator.base = (AActor *)0x0;
    pAVar1 = TActorIterator<AActor>::Next(&local_18);
    (this->super_APathFollower).super_AActor.tracer.field_0.p = pAVar1;
    if (pAVar1 != (AActor *)0x0) {
      if (((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        return;
      }
      (this->super_APathFollower).super_AActor.tracer.field_0.p = (AActor *)0x0;
    }
    Printf("MovingCamera %d: Can\'t find thing %d\n",
           (ulong)(uint)(this->super_APathFollower).super_AActor.tid,
           (ulong)(uint)(this->super_APathFollower).super_AActor.args[3]);
  }
  return;
}

Assistant:

void AMovingCamera::PostBeginPlay ()
{
	Super::PostBeginPlay ();

	Activator = NULL;
	if (args[3] != 0)
	{
		TActorIterator<AActor> iterator (args[3]);
		tracer = iterator.Next ();
		if (tracer == NULL)
		{
			Printf ("MovingCamera %d: Can't find thing %d\n", tid, args[3]);
		}
	}
}